

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgPolyhedra.cpp
# Opt level: O2

void __thiscall
dgPolyhedra::RefineTriangulation
          (dgPolyhedra *this,HaF64 *vertex,HaI32 stride,dgBigVector *normal,HaI32 perimeterCount,
          dgEdge **perimeter)

{
  int iVar1;
  HaI32 i0;
  HaI32 i1;
  int iVar2;
  int iVar3;
  dgEdge *pdVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  HaI32 i;
  long lVar17;
  dgMatrix *pdVar18;
  dgEdge *pdVar19;
  dgListNode *pdVar20;
  int iVar21;
  dgEdge **ppdVar22;
  dgEdge *pdVar23;
  long lVar24;
  dgEdge *pdVar25;
  dgEdge *pdVar26;
  ulong uVar27;
  bool bVar28;
  double dVar29;
  HaF64 HVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [64];
  undefined1 auVar40 [56];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  dgTemplateVector<float> dVar54;
  dgVector dVar55;
  dgDiagonalEdge key_1;
  dgDiagonalEdge key;
  double dStack_1e0;
  double dStack_1d8;
  float fStack_1d0;
  float fStack_1cc;
  undefined8 uStack_1b4;
  dgList<dgDiagonalEdge> dignonals;
  dgBigVector p0_1;
  dgBigVector p1p0;
  HaF64 error;
  dgBigVector p1_2;
  dgBigVector p0;
  undefined1 local_d8 [16];
  dgDiagonalEdge dStack_c8;
  float fStack_c0;
  float fStack_bc;
  dgTemplateVector<float> dStack_b8;
  float fStack_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  dgBigVector p3;
  dgBigVector p2;
  dgBigVector p1;
  undefined1 extraout_var [56];
  undefined1 auVar49 [56];
  
  dignonals._vptr_dgList = (_func_int **)&PTR__dgList_0118eb60;
  dignonals.m_count = 0;
  dignonals.m_last = (dgListNode *)0x0;
  dignonals.m_first = (dgListNode *)0x0;
  uVar27 = 1;
  do {
    if (uVar27 == (~(perimeterCount >> 0x1f) & perimeterCount) + 1) {
      lVar24 = (long)stride;
      pdVar19 = *perimeter;
      lVar17 = pdVar19->m_incidentVertex * lVar24;
      iVar21 = pdVar19->m_next->m_incidentVertex;
      dgBigVector::dgBigVector(&p0,vertex[lVar17],vertex[lVar17 + 1],vertex[lVar17 + 2],0.0);
      lVar17 = iVar21 * lVar24;
      dgBigVector::dgBigVector(&p1,vertex[lVar17],vertex[lVar17 + 1],vertex[lVar17 + 2],0.0);
      _key = (dgTemplateVector<float>)
             vsubpd_avx((undefined1  [16])p1.super_dgTemplateVector<double>._0_16_,
                        (undefined1  [16])p0.super_dgTemplateVector<double>._0_16_);
      dStack_1d8 = p1.super_dgTemplateVector<double>.m_z - p0.super_dgTemplateVector<double>.m_z;
      fStack_1d0 = SUB84(p1.super_dgTemplateVector<double>.m_w,0);
      fStack_1cc = (float)((ulong)p1.super_dgTemplateVector<double>.m_w >> 0x20);
      dgBigVector::dgBigVector(&p1p0,(dgTemplateVector<double> *)&key);
      auVar31._8_8_ = 0;
      auVar31._0_8_ = p1p0.super_dgTemplateVector<double>.m_x;
      auVar50._8_8_ = 0;
      auVar50._0_8_ = p1p0.super_dgTemplateVector<double>.m_z;
      pdVar19 = pdVar19->m_next;
      auVar41._8_8_ = 0;
      auVar41._0_8_ =
           p1p0.super_dgTemplateVector<double>.m_y * p1p0.super_dgTemplateVector<double>.m_y;
      auVar31 = vfmadd231sd_fma(auVar41,auVar31,auVar31);
      for (auVar31 = vfmadd213sd_fma(auVar50,auVar50,auVar31); dVar29 = auVar31._0_8_,
          dVar29 < 9.999999960041972e-13; auVar31 = vfmadd213sd_fma(auVar51,auVar51,auVar31)) {
        pdVar19 = pdVar19->m_next;
        lVar17 = pdVar19->m_incidentVertex * lVar24;
        dgBigVector::dgBigVector
                  ((dgBigVector *)&key,vertex[lVar17],vertex[lVar17 + 1],vertex[lVar17 + 2],0.0);
        p0_1.super_dgTemplateVector<double>._0_16_ =
             vsubpd_avx((undefined1  [16])_key,
                        (undefined1  [16])p0.super_dgTemplateVector<double>._0_16_);
        p0_1.super_dgTemplateVector<double>.m_z = dStack_1d8 - p0.super_dgTemplateVector<double>.m_z
        ;
        dgBigVector::dgBigVector((dgBigVector *)local_d8,&p0_1.super_dgTemplateVector<double>);
        p1p0.super_dgTemplateVector<double>.m_x = (double)local_d8._0_8_;
        p1p0.super_dgTemplateVector<double>.m_y = (double)local_d8._8_8_;
        p1p0.super_dgTemplateVector<double>.m_z = (double)dStack_c8;
        p1p0.super_dgTemplateVector<double>.m_w = (double)CONCAT44(fStack_bc,fStack_c0);
        auVar32._8_8_ = 0;
        auVar32._0_8_ = local_d8._0_8_;
        auVar51._8_8_ = 0;
        auVar51._0_4_ = dStack_c8.m_i0;
        auVar51._4_4_ = dStack_c8.m_i1;
        auVar42._8_8_ = 0;
        auVar42._0_8_ = (double)local_d8._8_8_ * (double)local_d8._8_8_;
        auVar31 = vfmadd231sd_fma(auVar42,auVar32,auVar32);
      }
      pdVar18 = dgGetIdentityMatrix();
      local_d8._0_8_ = *(undefined8 *)&(pdVar18->m_front).super_dgTemplateVector<float>;
      local_d8._8_8_ = *(undefined8 *)&(pdVar18->m_front).super_dgTemplateVector<float>.m_z;
      dStack_c8 = *(dgDiagonalEdge *)&(pdVar18->m_up).super_dgTemplateVector<float>;
      uVar5 = (pdVar18->m_up).super_dgTemplateVector<float>.m_z;
      uVar6 = (pdVar18->m_up).super_dgTemplateVector<float>.m_w;
      uVar7 = (pdVar18->m_right).super_dgTemplateVector<float>.m_x;
      uVar8 = (pdVar18->m_right).super_dgTemplateVector<float>.m_y;
      uVar9 = (pdVar18->m_right).super_dgTemplateVector<float>.m_z;
      uVar10 = (pdVar18->m_right).super_dgTemplateVector<float>.m_w;
      uVar11 = (pdVar18->m_posit).super_dgTemplateVector<float>.m_x;
      uVar12 = (pdVar18->m_posit).super_dgTemplateVector<float>.m_y;
      uVar13 = (pdVar18->m_posit).super_dgTemplateVector<float>.m_z;
      uVar14 = (pdVar18->m_posit).super_dgTemplateVector<float>.m_w;
      fStack_c0 = (float)uVar5;
      fStack_bc = (float)uVar6;
      dStack_b8.m_x = (float)uVar7;
      dStack_b8.m_y = (float)uVar8;
      dStack_b8.m_z = (float)uVar9;
      dStack_b8.m_w = (float)uVar10;
      fStack_a8 = (float)uVar11;
      fStack_a4 = (float)uVar12;
      fStack_a0 = (float)uVar13;
      fStack_9c = (float)uVar14;
      dgVector::dgVector((dgVector *)&key,&p0);
      fStack_a8 = key.m_i0;
      fStack_a4 = key.m_i1;
      fStack_a0 = key._8_4_;
      fStack_9c = key._12_4_;
      auVar33._8_8_ = 0;
      auVar33._0_8_ = dVar29;
      if (dVar29 < 0.0) {
        dVar29 = sqrt(dVar29);
      }
      else {
        auVar31 = vsqrtsd_avx(auVar33,auVar33);
        dVar29 = auVar31._0_8_;
      }
      dVar29 = 1.0 / dVar29;
      p0_1.super_dgTemplateVector<double>.m_z = dVar29 * p1p0.super_dgTemplateVector<double>.m_z;
      p0_1.super_dgTemplateVector<double>.m_x = dVar29 * p1p0.super_dgTemplateVector<double>.m_x;
      p0_1.super_dgTemplateVector<double>.m_y = dVar29 * p1p0.super_dgTemplateVector<double>.m_y;
      p0_1.super_dgTemplateVector<double>.m_w = p1p0.super_dgTemplateVector<double>.m_w;
      dgBigVector::dgBigVector((dgBigVector *)&key,&p0_1.super_dgTemplateVector<double>);
      dgVector::dgVector((dgVector *)&p1_2,(dgBigVector *)&key);
      local_d8._0_8_ = p1_2.super_dgTemplateVector<double>.m_x;
      local_d8._8_8_ = p1_2.super_dgTemplateVector<double>.m_y;
      auVar34._0_8_ =
           dgTemplateVector<double>::operator%
                     (&normal->super_dgTemplateVector<double>,
                      &normal->super_dgTemplateVector<double>);
      auVar34._8_56_ = extraout_var;
      if (auVar34._0_8_ < 0.0) {
        dVar29 = sqrt(auVar34._0_8_);
      }
      else {
        auVar31 = vsqrtsd_avx(auVar34._0_16_,auVar34._0_16_);
        dVar29 = auVar31._0_8_;
      }
      p0_1.super_dgTemplateVector<double>.m_w = (normal->super_dgTemplateVector<double>).m_w;
      dVar29 = 1.0 / dVar29;
      p0_1.super_dgTemplateVector<double>.m_z =
           dVar29 * (normal->super_dgTemplateVector<double>).m_z;
      auVar49 = (undefined1  [56])0x0;
      p0_1.super_dgTemplateVector<double>.m_y =
           dVar29 * (normal->super_dgTemplateVector<double>).m_y;
      p0_1.super_dgTemplateVector<double>.m_x =
           dVar29 * (normal->super_dgTemplateVector<double>).m_x;
      dgBigVector::dgBigVector((dgBigVector *)&key,&p0_1.super_dgTemplateVector<double>);
      dgVector::dgVector((dgVector *)&p1_2,(dgBigVector *)&key);
      auVar40 = ZEXT856((ulong)p1_2.super_dgTemplateVector<double>.m_y);
      dStack_b8.m_x = SUB84(p1_2.super_dgTemplateVector<double>.m_x,0);
      dStack_b8.m_y = (float)((ulong)p1_2.super_dgTemplateVector<double>.m_x >> 0x20);
      dStack_b8.m_z = SUB84(p1_2.super_dgTemplateVector<double>.m_y,0);
      dStack_b8.m_w = (float)((ulong)p1_2.super_dgTemplateVector<double>.m_y >> 0x20);
      dVar54 = dgTemplateVector<float>::operator*(&dStack_b8,(dgTemplateVector<float> *)local_d8);
      auVar44._0_8_ = dVar54._8_8_;
      auVar44._8_56_ = auVar49;
      auVar35._0_8_ = dVar54._0_8_;
      auVar35._8_56_ = auVar40;
      p0_1.super_dgTemplateVector<double>._0_16_ = vunpcklpd_avx(auVar35._0_16_,auVar44._0_16_);
      dgVector::dgVector((dgVector *)&key,(dgTemplateVector<float> *)&p0_1);
      dStack_c8 = key;
      fStack_c0 = key._8_4_;
      fStack_bc = key._12_4_;
      dgMatrix::Inverse((dgMatrix *)&key,(dgMatrix *)local_d8);
      dVar54 = _key;
      fStack_a4 = (float)uStack_1b4;
      fStack_a0 = SUB84(uStack_1b4,4);
      local_d8._0_4_ = key.m_i0;
      local_d8._4_4_ = key.m_i1;
      local_d8._8_8_ = dStack_1e0;
      fStack_c0 = fStack_1d0;
      fStack_bc = fStack_1cc;
      fStack_9c = 1.0;
      iVar21 = dignonals.m_count * dignonals.m_count;
      _key = dVar54;
      dStack_c8 = (dgDiagonalEdge)dStack_1d8;
      while( true ) {
        bVar28 = iVar21 == 0;
        iVar21 = iVar21 + -1;
        if ((dignonals.m_count == 0) || (bVar28)) break;
        i0 = ((dignonals.m_first)->m_info).m_i0;
        i1 = ((dignonals.m_first)->m_info).m_i1;
        dgList<dgDiagonalEdge>::Remove(&dignonals,dignonals.m_first);
        pdVar19 = FindEdge(this,i0,i1);
        if (pdVar19 != (dgEdge *)0x0) {
          lVar17 = pdVar19->m_incidentVertex * lVar24;
          iVar1 = pdVar19->m_next->m_incidentVertex;
          iVar2 = pdVar19->m_next->m_next->m_incidentVertex;
          iVar3 = pdVar19->m_twin->m_prev->m_incidentVertex;
          dgBigVector::dgBigVector(&p0_1,vertex[lVar17],vertex[lVar17 + 1],vertex[lVar17 + 2],0.0);
          lVar17 = iVar1 * lVar24;
          dgBigVector::dgBigVector(&p1_2,vertex[lVar17],vertex[lVar17 + 1],vertex[lVar17 + 2],0.0);
          lVar17 = iVar2 * lVar24;
          dgBigVector::dgBigVector(&p2,vertex[lVar17],vertex[lVar17 + 1],vertex[lVar17 + 2],0.0);
          lVar17 = iVar3 * lVar24;
          auVar40 = (undefined1  [56])0x0;
          auVar49 = (undefined1  [56])0x0;
          dgBigVector::dgBigVector(&p3,vertex[lVar17],vertex[lVar17 + 1],vertex[lVar17 + 2],0.0);
          dgVector::dgVector((dgVector *)&key_1,&p0_1);
          dVar55 = dgMatrix::TransformVector((dgMatrix *)local_d8,(dgVector *)&key_1);
          auVar45._0_8_ = dVar55.super_dgTemplateVector<float>._8_8_;
          auVar45._8_56_ = auVar49;
          auVar36._0_8_ = dVar55.super_dgTemplateVector<float>._0_8_;
          auVar36._8_56_ = auVar40;
          uVar27 = auVar49._0_8_;
          _error = (dgTemplateVector<float>)vunpcklpd_avx(auVar36._0_16_,auVar45._0_16_);
          dgBigVector::dgBigVector((dgBigVector *)&key,(dgVector *)&error);
          p0_1.super_dgTemplateVector<double>.m_w = (double)CONCAT44(fStack_1cc,fStack_1d0);
          p0_1.super_dgTemplateVector<double>._0_16_ = _key;
          p0_1.super_dgTemplateVector<double>.m_z = dStack_1d8;
          auVar40 = ZEXT856((ulong)dStack_1e0);
          auVar49 = ZEXT856(uVar27);
          dgVector::dgVector((dgVector *)&key_1,&p1_2);
          dVar55 = dgMatrix::TransformVector((dgMatrix *)local_d8,(dgVector *)&key_1);
          auVar46._0_8_ = dVar55.super_dgTemplateVector<float>._8_8_;
          auVar46._8_56_ = auVar49;
          auVar37._0_8_ = dVar55.super_dgTemplateVector<float>._0_8_;
          auVar37._8_56_ = auVar40;
          uVar27 = auVar49._0_8_;
          _error = (dgTemplateVector<float>)vunpcklpd_avx(auVar37._0_16_,auVar46._0_16_);
          dgBigVector::dgBigVector((dgBigVector *)&key,(dgVector *)&error);
          p1_2.super_dgTemplateVector<double>.m_w = (double)CONCAT44(fStack_1cc,fStack_1d0);
          p1_2.super_dgTemplateVector<double>.m_x = (double)key;
          p1_2.super_dgTemplateVector<double>.m_y = dStack_1e0;
          p1_2.super_dgTemplateVector<double>.m_z = dStack_1d8;
          auVar40 = ZEXT856((ulong)dStack_1e0);
          auVar49 = ZEXT856(uVar27);
          dgVector::dgVector((dgVector *)&key_1,&p2);
          dVar55 = dgMatrix::TransformVector((dgMatrix *)local_d8,(dgVector *)&key_1);
          auVar47._0_8_ = dVar55.super_dgTemplateVector<float>._8_8_;
          auVar47._8_56_ = auVar49;
          auVar38._0_8_ = dVar55.super_dgTemplateVector<float>._0_8_;
          auVar38._8_56_ = auVar40;
          uVar27 = auVar49._0_8_;
          _error = (dgTemplateVector<float>)vunpcklpd_avx(auVar38._0_16_,auVar47._0_16_);
          dgBigVector::dgBigVector((dgBigVector *)&key,(dgVector *)&error);
          p2.super_dgTemplateVector<double>.m_w = (double)CONCAT44(fStack_1cc,fStack_1d0);
          p2.super_dgTemplateVector<double>.m_x = (double)key;
          p2.super_dgTemplateVector<double>.m_y = dStack_1e0;
          p2.super_dgTemplateVector<double>.m_z = dStack_1d8;
          auVar40 = ZEXT856((ulong)dStack_1e0);
          auVar49 = ZEXT856(uVar27);
          dgVector::dgVector((dgVector *)&key_1,&p3);
          dVar55 = dgMatrix::TransformVector((dgMatrix *)local_d8,(dgVector *)&key_1);
          auVar48._0_8_ = dVar55.super_dgTemplateVector<float>._8_8_;
          auVar48._8_56_ = auVar49;
          auVar39._0_8_ = dVar55.super_dgTemplateVector<float>._0_8_;
          auVar39._8_56_ = auVar40;
          _error = (dgTemplateVector<float>)vunpcklpd_avx(auVar39._0_16_,auVar48._0_16_);
          dgBigVector::dgBigVector((dgBigVector *)&key,(dgVector *)&error);
          p3.super_dgTemplateVector<double>.m_w = (double)CONCAT44(fStack_1cc,fStack_1d0);
          p3.super_dgTemplateVector<double>.m_x = (double)key;
          p3.super_dgTemplateVector<double>.m_y = dStack_1e0;
          p3.super_dgTemplateVector<double>.m_z = dStack_1d8;
          dVar54 = (dgTemplateVector<float>)
                   vsubpd_avx((undefined1  [16])p0_1.super_dgTemplateVector<double>._0_16_,
                              (undefined1  [16])_key);
          auVar52._0_8_ = dVar54._0_8_ * dVar54._0_8_;
          auVar52._8_8_ = dVar54._8_8_ * dVar54._8_8_;
          auVar31 = vshufpd_avx(auVar52,auVar52,1);
          auVar31 = vfmadd231sd_fma(auVar31,(undefined1  [16])dVar54,(undefined1  [16])dVar54);
          auVar15._8_8_ = p1_2.super_dgTemplateVector<double>.m_y;
          auVar15._0_8_ = p1_2.super_dgTemplateVector<double>.m_x;
          dStack_1d8 = auVar31._0_8_;
          auVar41 = vsubpd_avx(auVar15,(undefined1  [16])_key);
          auVar53._0_8_ = auVar41._0_8_ * auVar41._0_8_;
          auVar53._8_8_ = auVar41._8_8_ * auVar41._8_8_;
          fStack_1d0 = auVar41._0_4_;
          fStack_1cc = auVar41._4_4_;
          auVar31 = vshufpd_avx(auVar53,auVar53,1);
          vfmadd231sd_fma(auVar31,auVar41,auVar41);
          auVar16._8_8_ = p2.super_dgTemplateVector<double>.m_y;
          auVar16._0_8_ = p2.super_dgTemplateVector<double>.m_x;
          auVar41 = vsubpd_avx(auVar16,(undefined1  [16])_key);
          auVar43._0_8_ = auVar41._0_8_ * auVar41._0_8_;
          auVar43._8_8_ = auVar41._8_8_ * auVar41._8_8_;
          auVar31 = vshufpd_avx(auVar43,auVar43,1);
          vfmadd231sd_fma(auVar31,auVar41,auVar41);
          _key = dVar54;
          HVar30 = Determinant3x3((HaF64 (*) [3])&key,&error);
          if ((double)HVar30 < 0.0) {
            pdVar23 = pdVar19->m_prev;
            pdVar26 = pdVar19->m_twin->m_prev;
            FlipEdge(this,pdVar19);
            if (4 < perimeterCount) {
              pdVar19 = pdVar26->m_next;
              pdVar25 = pdVar23->m_next;
              for (uVar27 = 0; (uint)perimeterCount != uVar27; uVar27 = uVar27 + 1) {
                pdVar4 = perimeter[uVar27];
                if (pdVar23 == pdVar4) {
                  pdVar23 = (dgEdge *)0x0;
                }
                if (pdVar25 == pdVar4) {
                  pdVar25 = (dgEdge *)0x0;
                }
                if (pdVar26 == pdVar4) {
                  pdVar26 = (dgEdge *)0x0;
                }
                if (pdVar19 == pdVar4) {
                  pdVar19 = (dgEdge *)0x0;
                }
              }
              if (((pdVar26 != (dgEdge *)0x0) && (0 < pdVar26->m_incidentFace)) &&
                 (0 < pdVar26->m_twin->m_incidentFace)) {
                key_1.m_i0 = pdVar26->m_incidentVertex;
                key_1.m_i1 = pdVar26->m_twin->m_incidentVertex;
                dgList<dgDiagonalEdge>::Append(&dignonals,&key_1);
              }
              if (((pdVar19 != (dgEdge *)0x0) && (0 < pdVar19->m_incidentFace)) &&
                 (0 < pdVar19->m_twin->m_incidentFace)) {
                key_1.m_i0 = pdVar19->m_incidentVertex;
                key_1.m_i1 = pdVar19->m_twin->m_incidentVertex;
                dgList<dgDiagonalEdge>::Append(&dignonals,&key_1);
              }
              if (((pdVar23 != (dgEdge *)0x0) && (0 < pdVar23->m_incidentFace)) &&
                 (0 < pdVar23->m_twin->m_incidentFace)) {
                key_1.m_i0 = pdVar23->m_incidentVertex;
                key_1.m_i1 = pdVar23->m_twin->m_incidentVertex;
                dgList<dgDiagonalEdge>::Append(&dignonals,&key_1);
              }
              if (((pdVar25 != (dgEdge *)0x0) && (0 < pdVar25->m_incidentFace)) &&
                 (0 < pdVar25->m_twin->m_incidentFace)) {
                key_1.m_i0 = pdVar25->m_incidentVertex;
                key_1.m_i1 = pdVar25->m_twin->m_incidentVertex;
                dgList<dgDiagonalEdge>::Append(&dignonals,&key_1);
              }
            }
          }
        }
      }
      dgList<dgDiagonalEdge>::~dgList(&dignonals);
      return;
    }
    ppdVar22 = perimeter + uVar27;
    pdVar19 = ppdVar22[-1];
LAB_00da31fa:
    pdVar23 = (*ppdVar22)->m_prev;
    if (pdVar23 != pdVar19) {
      ppdVar22 = &pdVar23->m_twin;
      for (pdVar20 = dignonals.m_first; pdVar20 != (dgListNode *)0x0; pdVar20 = pdVar20->m_next) {
        iVar21 = (pdVar20->m_info).m_i0;
        iVar1 = (pdVar20->m_info).m_i1;
        if (((iVar21 == pdVar23->m_incidentVertex) && (iVar1 == (*ppdVar22)->m_incidentVertex)) ||
           ((iVar1 == pdVar23->m_incidentVertex && (iVar21 == (*ppdVar22)->m_incidentVertex))))
        goto LAB_00da31fa;
      }
      key.m_i1 = pdVar23->m_twin->m_incidentVertex;
      key.m_i0 = pdVar23->m_incidentVertex;
      dgList<dgDiagonalEdge>::Append(&dignonals,&key);
      goto LAB_00da31fa;
    }
    uVar27 = uVar27 + 1;
  } while( true );
}

Assistant:

void dgPolyhedra::RefineTriangulation (const hacd::HaF64* const vertex, hacd::HaI32 stride, dgBigVector* const normal, hacd::HaI32 perimeterCount, dgEdge** const perimeter)
{
	dgList<dgDiagonalEdge> dignonals;

	for (hacd::HaI32 i = 1; i <= perimeterCount; i ++) {
		dgEdge* const last = perimeter[i - 1];
		for (dgEdge* ptr = perimeter[i]->m_prev; ptr != last; ptr = ptr->m_twin->m_prev) {
			dgList<dgDiagonalEdge>::dgListNode* node = dignonals.GetFirst();
			for (; node; node = node->GetNext()) {
				const dgDiagonalEdge& key = node->GetInfo();
				if (((key.m_i0 == ptr->m_incidentVertex) && (key.m_i1 == ptr->m_twin->m_incidentVertex)) ||
					((key.m_i1 == ptr->m_incidentVertex) && (key.m_i0 == ptr->m_twin->m_incidentVertex))) {
						break;
				}
			}
			if (!node) {
				dgDiagonalEdge key (ptr);
				dignonals.Append(key);
			}
		}
	}

	dgEdge* const face = perimeter[0];
	hacd::HaI32 i0 = face->m_incidentVertex * stride;
	hacd::HaI32 i1 = face->m_next->m_incidentVertex * stride;
	dgBigVector p0 (vertex[i0], vertex[i0 + 1], vertex[i0 + 2], hacd::HaF32 (0.0f));
	dgBigVector p1 (vertex[i1], vertex[i1 + 1], vertex[i1 + 2], hacd::HaF32 (0.0f));

	dgBigVector p1p0 (p1 - p0);
	hacd::HaF64 mag2 = p1p0 % p1p0;
	for (dgEdge* ptr = face->m_next->m_next; mag2 < hacd::HaF32 (1.0e-12f); ptr = ptr->m_next) {
		hacd::HaI32 i1 = ptr->m_incidentVertex * stride;
		dgBigVector p1 (vertex[i1], vertex[i1 + 1], vertex[i1 + 2], hacd::HaF32 (0.0f));
		p1p0 = p1 - p0;
		mag2 = p1p0 % p1p0;
	}

	dgMatrix matrix (dgGetIdentityMatrix());
	matrix.m_posit = p0;
	matrix.m_front = dgVector (p1p0.Scale (hacd::HaF64 (1.0f) / sqrt (mag2)));
	matrix.m_right = dgVector (normal->Scale (hacd::HaF64 (1.0f) / sqrt (*normal % *normal)));
	matrix.m_up = matrix.m_right * matrix.m_front;
	matrix = matrix.Inverse();
	matrix.m_posit.m_w = hacd::HaF32 (1.0f);

	hacd::HaI32 maxCount = dignonals.GetCount() * dignonals.GetCount();
	while (dignonals.GetCount() && maxCount) {
		maxCount --;
		dgList<dgDiagonalEdge>::dgListNode* const node = dignonals.GetFirst();
		dgDiagonalEdge key (node->GetInfo());
		dignonals.Remove(node);
		dgEdge* const edge = FindEdge(key.m_i0, key.m_i1);
		if (edge) {
			hacd::HaI32 i0 = edge->m_incidentVertex * stride;
			hacd::HaI32 i1 = edge->m_next->m_incidentVertex * stride;
			hacd::HaI32 i2 = edge->m_next->m_next->m_incidentVertex * stride;
			hacd::HaI32 i3 = edge->m_twin->m_prev->m_incidentVertex * stride;

			dgBigVector p0 (vertex[i0], vertex[i0 + 1], vertex[i0 + 2], hacd::HaF64 (0.0f));
			dgBigVector p1 (vertex[i1], vertex[i1 + 1], vertex[i1 + 2], hacd::HaF64 (0.0f));
			dgBigVector p2 (vertex[i2], vertex[i2 + 1], vertex[i2 + 2], hacd::HaF64 (0.0f));
			dgBigVector p3 (vertex[i3], vertex[i3 + 1], vertex[i3 + 2], hacd::HaF64 (0.0f));

			p0 = matrix.TransformVector(p0);
			p1 = matrix.TransformVector(p1);
			p2 = matrix.TransformVector(p2);
			p3 = matrix.TransformVector(p3);

			hacd::HaF64 circleTest[3][3];
			circleTest[0][0] = p0[0] - p3[0];
			circleTest[0][1] = p0[1] - p3[1];
			circleTest[0][2] = circleTest[0][0] * circleTest[0][0] + circleTest[0][1] * circleTest[0][1];

			circleTest[1][0] = p1[0] - p3[0];
			circleTest[1][1] = p1[1] - p3[1];
			circleTest[1][2] = circleTest[1][0] * circleTest[1][0] + circleTest[1][1] * circleTest[1][1];

			circleTest[2][0] = p2[0] - p3[0];
			circleTest[2][1] = p2[1] - p3[1];
			circleTest[2][2] = circleTest[2][0] * circleTest[2][0] + circleTest[2][1] * circleTest[2][1];

			hacd::HaF64 error;
			hacd::HaF64 det = Determinant3x3 (circleTest, &error);
			if (det < hacd::HaF32 (0.0f)) {
				dgEdge* frontFace0 = edge->m_prev;
				dgEdge* backFace0 = edge->m_twin->m_prev;

				FlipEdge(edge);

				if (perimeterCount > 4) {
					dgEdge* backFace1 = backFace0->m_next;
					dgEdge* frontFace1 = frontFace0->m_next;
					for (hacd::HaI32 i = 0; i < perimeterCount; i ++) {
						if (frontFace0 == perimeter[i]) {
							frontFace0 = NULL;
						}
						if (frontFace1 == perimeter[i]) {
							frontFace1 = NULL;
						}

						if (backFace0 == perimeter[i]) {
							backFace0 = NULL;
						}
						if (backFace1 == perimeter[i]) {
							backFace1 = NULL;
						}
					}

					if (backFace0 && (backFace0->m_incidentFace > 0) && (backFace0->m_twin->m_incidentFace > 0)) {
						dgDiagonalEdge key (backFace0);
						dignonals.Append(key);
					}
					if (backFace1 && (backFace1->m_incidentFace > 0) && (backFace1->m_twin->m_incidentFace > 0)) {
						dgDiagonalEdge key (backFace1);
						dignonals.Append(key);
					}

					if (frontFace0 && (frontFace0->m_incidentFace > 0) && (frontFace0->m_twin->m_incidentFace > 0)) {
						dgDiagonalEdge key (frontFace0);
						dignonals.Append(key);
					}

					if (frontFace1 && (frontFace1->m_incidentFace > 0) && (frontFace1->m_twin->m_incidentFace > 0)) {
						dgDiagonalEdge key (frontFace1);
						dignonals.Append(key);
					}
				}
			}
		}
	}
}